

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xinput.c
# Opt level: O3

xcb_generic_iterator_t
xcb_input_get_device_key_mapping_keysyms_end(xcb_input_get_device_key_mapping_reply_t *R)

{
  xcb_generic_iterator_t xVar1;
  
  xVar1.data = R[1].pad0 + (ulong)R->length * 4 + -9;
  xVar1._8_8_ = (ulong)(uint)((int)xVar1.data - (int)R) << 0x20;
  return xVar1;
}

Assistant:

xcb_generic_iterator_t
xcb_input_get_device_key_mapping_keysyms_end (const xcb_input_get_device_key_mapping_reply_t *R)
{
    xcb_generic_iterator_t i;
    i.data = ((xcb_keysym_t *) (R + 1)) + (R->length);
    i.rem = 0;
    i.index = (char *) i.data - (char *) R;
    return i;
}